

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O0

void __thiscall
cmCTestMultiProcessHandler::GetAllTestDependencies
          (cmCTestMultiProcessHandler *this,int test,TestList *dependencies)

{
  bool bVar1;
  reference piVar2;
  _Self local_38;
  _Self local_30;
  const_iterator i;
  TestSet *dependencySet;
  TestList *dependencies_local;
  cmCTestMultiProcessHandler *pcStack_10;
  int test_local;
  cmCTestMultiProcessHandler *this_local;
  
  dependencies_local._4_4_ = test;
  pcStack_10 = this;
  i._M_node = (_Base_ptr)
              std::
              map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
              ::operator[](&(this->Tests).
                            super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                           ,(key_type *)((long)&dependencies_local + 4));
  local_30._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                 ((set<int,_std::less<int>,_std::allocator<int>_> *)i._M_node);
  while( true ) {
    local_38._M_node =
         (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::end(i._M_node);
    bVar1 = std::operator!=(&local_30,&local_38);
    if (!bVar1) break;
    piVar2 = std::_Rb_tree_const_iterator<int>::operator*(&local_30);
    GetAllTestDependencies(this,*piVar2,dependencies);
    piVar2 = std::_Rb_tree_const_iterator<int>::operator*(&local_30);
    std::vector<int,_std::allocator<int>_>::push_back
              (&dependencies->super_vector<int,_std::allocator<int>_>,piVar2);
    std::_Rb_tree_const_iterator<int>::operator++(&local_30);
  }
  return;
}

Assistant:

void cmCTestMultiProcessHandler::GetAllTestDependencies(
    int test, TestList& dependencies)
{
  TestSet const& dependencySet = this->Tests[test];
  for(TestSet::const_iterator i = dependencySet.begin();
    i != dependencySet.end(); ++i)
    {
    GetAllTestDependencies(*i, dependencies);
    dependencies.push_back(*i);
    }
}